

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void * stbi__load_gif_main(stbi__context *s,int **delays,int *x,int *y,int *z,int *comp,int req_comp
                          )

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  uint *in_RCX;
  uint *in_RDX;
  long *in_RSI;
  stbi_uc *in_RDI;
  uint *in_R8;
  int *new_delays;
  void *tmp;
  int delays_size;
  int out_size;
  int stride;
  stbi__gif g;
  stbi_uc *two_back;
  stbi_uc *out;
  stbi_uc *u;
  int layers;
  stbi_uc *in_stack_ffffffffffff7718;
  stbi__gif *in_stack_ffffffffffff7720;
  uint in_stack_ffffffffffff7738;
  uint in_stack_ffffffffffff773c;
  int in_stack_ffffffffffff7740;
  int in_stack_ffffffffffff7744;
  uchar *in_stack_ffffffffffff7748;
  void *local_88b0;
  stbi_uc *in_stack_ffffffffffff7768;
  int in_stack_ffffffffffff7774;
  int *in_stack_ffffffffffff7778;
  stbi__gif *in_stack_ffffffffffff7780;
  stbi__context *in_stack_ffffffffffff7788;
  undefined4 local_60;
  stbi__gif *local_50;
  stbi_uc *local_48;
  uint local_3c;
  stbi__gif *local_8;
  
  iVar1 = stbi__gif_test((stbi__context *)in_stack_ffffffffffff7720);
  if (iVar1 == 0) {
    stbi__err((char *)in_stack_ffffffffffff7720);
    local_8 = (stbi__gif *)0x0;
  }
  else {
    local_3c = 0;
    local_50 = (stbi__gif *)0x0;
    memset(&stack0xffffffffffff7738,0,0x8870);
    if (in_RSI != (long *)0x0) {
      *in_RSI = 0;
    }
    do {
      local_48 = stbi__gif_load_next(in_stack_ffffffffffff7788,in_stack_ffffffffffff7780,
                                     in_stack_ffffffffffff7778,in_stack_ffffffffffff7774,
                                     in_stack_ffffffffffff7768);
      if (local_48 == in_RDI) {
        local_48 = (stbi_uc *)0x0;
      }
      uVar2 = local_3c;
      if (local_48 != (stbi_uc *)0x0) {
        *in_RDX = in_stack_ffffffffffff7738;
        *in_RCX = in_stack_ffffffffffff773c;
        uVar2 = local_3c + 1;
        iVar1 = in_stack_ffffffffffff7738 * in_stack_ffffffffffff773c * 4;
        if (local_50 == (stbi__gif *)0x0) {
          local_50 = (stbi__gif *)stbi__malloc(0x42b568);
          if (local_50 == (stbi__gif *)0x0) {
            pvVar3 = stbi__load_gif_main_outofmem
                               (in_stack_ffffffffffff7720,in_stack_ffffffffffff7718,(int **)0x42b595
                               );
            return pvVar3;
          }
          if (in_RSI != (long *)0x0) {
            pvVar3 = stbi__malloc(0x42b5ce);
            *in_RSI = (long)pvVar3;
            if (*in_RSI == 0) {
              pvVar3 = stbi__load_gif_main_outofmem
                                 (in_stack_ffffffffffff7720,in_stack_ffffffffffff7718,
                                  (int **)0x42b604);
              return pvVar3;
            }
          }
        }
        else {
          local_50 = (stbi__gif *)realloc(local_50,(long)(int)(uVar2 * iVar1));
          if (local_50 == (stbi__gif *)0x0) {
            pvVar3 = stbi__load_gif_main_outofmem
                               ((stbi__gif *)0x0,in_stack_ffffffffffff7718,(int **)0x42b4ad);
            return pvVar3;
          }
          in_stack_ffffffffffff7720 = local_50;
          if (in_RSI != (long *)0x0) {
            in_stack_ffffffffffff7718 = (stbi_uc *)realloc((void *)*in_RSI,(long)(int)uVar2 << 2);
            if (in_stack_ffffffffffff7718 == (stbi_uc *)0x0) {
              pvVar3 = stbi__load_gif_main_outofmem
                                 (in_stack_ffffffffffff7720,(stbi_uc *)0x0,(int **)0x42b523);
              return pvVar3;
            }
            *in_RSI = (long)in_stack_ffffffffffff7718;
          }
        }
        memcpy((void *)((long)&((stbi__gif *)(local_50->pal + -0xd))->w +
                       (long)(int)(local_3c * iVar1)),local_48,(long)iVar1);
        if (in_RSI != (long *)0x0) {
          *(undefined4 *)(*in_RSI + (ulong)local_3c * 4) = local_60;
        }
      }
      local_3c = uVar2;
    } while (local_48 != (stbi_uc *)0x0);
    free((void *)CONCAT44(in_stack_ffffffffffff7744,in_stack_ffffffffffff7740));
    free(local_88b0);
    free(in_stack_ffffffffffff7748);
    if (((int)tmp != 0) && ((int)tmp != 4)) {
      local_50 = (stbi__gif *)
                 stbi__convert_format
                           (in_stack_ffffffffffff7748,in_stack_ffffffffffff7744,
                            in_stack_ffffffffffff7740,in_stack_ffffffffffff773c,
                            in_stack_ffffffffffff7738);
    }
    *in_R8 = local_3c;
    local_8 = local_50;
  }
  return local_8;
}

Assistant:

static void *stbi__load_gif_main(stbi__context *s, int **delays, int *x, int *y, int *z, int *comp, int req_comp)
{
   if (stbi__gif_test(s)) {
      int layers = 0;
      stbi_uc *u = 0;
      stbi_uc *out = 0;
      stbi_uc *two_back = 0;
      stbi__gif g;
      int stride;
      int out_size = 0;
      int delays_size = 0;

      STBI_NOTUSED(out_size);
      STBI_NOTUSED(delays_size);

      memset(&g, 0, sizeof(g));
      if (delays) {
         *delays = 0;
      }

      do {
         u = stbi__gif_load_next(s, &g, comp, req_comp, two_back);
         if (u == (stbi_uc *) s) u = 0;  // end of animated gif marker

         if (u) {
            *x = g.w;
            *y = g.h;
            ++layers;
            stride = g.w * g.h * 4;

            if (out) {
               void *tmp = (stbi_uc*) STBI_REALLOC_SIZED( out, out_size, layers * stride );
               if (!tmp)
                  return stbi__load_gif_main_outofmem(&g, out, delays);
               else {
                   out = (stbi_uc*) tmp;
                   out_size = layers * stride;
               }

               if (delays) {
                  int *new_delays = (int*) STBI_REALLOC_SIZED( *delays, delays_size, sizeof(int) * layers );
                  if (!new_delays)
                     return stbi__load_gif_main_outofmem(&g, out, delays);
                  *delays = new_delays;
                  delays_size = layers * sizeof(int);
               }
            } else {
               out = (stbi_uc*)stbi__malloc( layers * stride );
               if (!out)
                  return stbi__load_gif_main_outofmem(&g, out, delays);
               out_size = layers * stride;
               if (delays) {
                  *delays = (int*) stbi__malloc( layers * sizeof(int) );
                  if (!*delays)
                     return stbi__load_gif_main_outofmem(&g, out, delays);
                  delays_size = layers * sizeof(int);
               }
            }
            memcpy( out + ((layers - 1) * stride), u, stride );
            if (layers >= 2) {
               two_back = out - 2 * stride;
            }

            if (delays) {
               (*delays)[layers - 1U] = g.delay;
            }
         }
      } while (u != 0);

      // free temp buffer;
      STBI_FREE(g.out);
      STBI_FREE(g.history);
      STBI_FREE(g.background);

      // do the final conversion after loading everything;
      if (req_comp && req_comp != 4)
         out = stbi__convert_format(out, 4, req_comp, layers * g.w, g.h);

      *z = layers;
      return out;
   } else {
      return stbi__errpuc("not GIF", "Image was not as a gif type.");
   }
}